

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O0

void __thiscall OpenMD::DumpReader::~DumpReader(DumpReader *this)

{
  long in_RDI;
  vector<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_> *unaff_retaddr;
  
  std::vector<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>::~vector
            (unaff_retaddr);
  std::ifstream::~ifstream((void *)(in_RDI + 0x30));
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  return;
}

Assistant:

DumpReader::~DumpReader() {
#ifdef IS_MPI
    strcpy(checkPointMsg, "Dump file closed successfully.");
    errorCheckPoint();
#endif
  }